

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::BlindIssuance
          (ConfidentialTransactionContext *this,
          map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          *issuance_key_map,
          vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
          *confidential_addresses,int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *blinder_list)

{
  bool bVar1;
  undefined8 uVar2;
  long in_RDX;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>,_bool>
  pVar3;
  UtxoData *in_stack_00000008;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  confidential_addrs;
  BlindParameter param;
  OutPoint outpoint;
  ConfidentialTxIn *txin_ref;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *__range1;
  UtxoData utxo;
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  utxo_info_map;
  UnblindParameter *in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff92f;
  _Rb_tree_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>
  in_stack_fffffffffffff930;
  UnblindParameter *in_stack_fffffffffffff940;
  CfdException *this_00;
  int in_stack_fffffffffffff964;
  int64_t in_stack_fffffffffffff968;
  _Rb_tree_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>
  in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff979;
  UtxoData *in_stack_fffffffffffff980;
  UtxoData *in_stack_fffffffffffff988;
  OutPoint *in_stack_fffffffffffff990;
  ConfidentialTransactionContext *in_stack_fffffffffffff998;
  int in_stack_fffffffffffff9a0;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *in_stack_fffffffffffff9a8;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  *in_stack_fffffffffffff9b8;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  *in_stack_fffffffffffff9c0;
  BlindFactor local_630;
  BlindFactor local_610;
  ConfidentialValue local_5f0;
  undefined1 local_5c2;
  undefined1 local_5c1 [33];
  OutPoint local_5a0;
  reference local_578;
  __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_570;
  __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_568;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *local_560;
  Amount local_2f0 [2];
  ConfidentialAssetId local_2d0 [11];
  BlindFactor local_f8;
  BlindFactor local_d8 [6];
  long local_18;
  
  local_18 = in_RDX;
  std::
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
         *)0x5549b9);
  UtxoData::UtxoData(in_stack_fffffffffffff980);
  local_560 = (vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
              (in_RDI + 0x10);
  local_568._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::begin
                 (local_560);
  local_570._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::end
                 (local_560);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_568,&local_570);
    if (!bVar1) {
      std::
      vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
      ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                *)0x554cf0);
      if (local_18 != 0) {
        std::
        vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
        ::operator=(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      }
      BlindTransaction((ConfidentialTransactionContext *)in_stack_fffffffffffff988,
                       (map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
                        *)in_stack_fffffffffffff980,
                       (map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
                        *)CONCAT71(in_stack_fffffffffffff979,in_stack_fffffffffffff978),
                       (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                        *)in_stack_fffffffffffff970._M_node,in_stack_fffffffffffff968,
                       in_stack_fffffffffffff964,in_stack_fffffffffffff9a0,in_stack_fffffffffffff9a8
                      );
      std::
      vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
      ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                 *)in_stack_fffffffffffff930._M_node);
      UtxoData::~UtxoData(in_stack_00000008);
      std::
      map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
      ::~map((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
              *)0x554d9e);
      return;
    }
    local_578 = __gnu_cxx::
                __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
                ::operator*(&local_568);
    core::AbstractTxIn::GetOutPoint(&local_5a0,&local_578->super_AbstractTxIn);
    bVar1 = IsFindUtxoMap(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                          in_stack_fffffffffffff988);
    if (!bVar1) break;
    core::UnblindParameter::UnblindParameter(in_stack_fffffffffffff940);
    core::ConfidentialAssetId::operator=((ConfidentialAssetId *)&stack0xfffffffffffff9a8,local_2d0);
    core::BlindFactor::operator=(&local_630,&local_f8);
    core::BlindFactor::operator=(&local_610,local_d8);
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&stack0xfffffffffffff980,local_2f0);
    core::ConfidentialValue::operator=(&local_5f0,(ConfidentialValue *)&stack0xfffffffffffff980);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x554c2d);
    pVar3 = std::
            map<cfd::core::OutPoint,cfd::core::UnblindParameter,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>>
            ::emplace<cfd::core::OutPoint&,cfd::core::UnblindParameter&>
                      ((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
                        *)in_stack_fffffffffffff930._M_node,
                       (OutPoint *)CONCAT17(in_stack_fffffffffffff92f,in_stack_fffffffffffff928),
                       in_stack_fffffffffffff920);
    in_stack_fffffffffffff930 = pVar3.first._M_node;
    in_stack_fffffffffffff92f = pVar3.second;
    in_stack_fffffffffffff970._M_node = in_stack_fffffffffffff930._M_node;
    in_stack_fffffffffffff978 = in_stack_fffffffffffff92f;
    core::UnblindParameter::~UnblindParameter(in_stack_fffffffffffff920);
    core::OutPoint::~OutPoint((OutPoint *)0x554c81);
    __gnu_cxx::
    __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
    ::operator++(&local_568);
  }
  local_5c2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  this_00 = (CfdException *)local_5c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_5c1 + 1),"Utxo is not found. blind fail.",(allocator *)this_00);
  core::CfdException::CfdException
            (this_00,(CfdError)((ulong)uVar2 >> 0x20),(string *)in_stack_fffffffffffff930._M_node);
  local_5c2 = 0;
  __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void ConfidentialTransactionContext::BlindIssuance(
    const std::map<OutPoint, IssuanceBlindingKeyPair>& issuance_key_map,
    const std::vector<ElementsConfidentialAddress>* confidential_addresses,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<BlindData>* blinder_list) {
  std::map<OutPoint, BlindParameter> utxo_info_map;
  UtxoData utxo;
  for (const auto& txin_ref : vin_) {
    OutPoint outpoint = txin_ref.GetOutPoint();
    if (!IsFindUtxoMap(outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Utxo is not found. blind fail.");
    }
    BlindParameter param;
    param.asset = utxo.asset;
    param.abf = utxo.asset_blind_factor;
    param.vbf = utxo.amount_blind_factor;
    param.value = ConfidentialValue(utxo.amount);
    utxo_info_map.emplace(outpoint, param);
  }
  // confidentialkey is already set to nonce.

  std::vector<ElementsConfidentialAddress> confidential_addrs;
  if (confidential_addresses != nullptr) {
    // set updating keys.
    confidential_addrs = *confidential_addresses;
  }
  BlindTransaction(
      utxo_info_map, issuance_key_map, confidential_addrs, minimum_range_value,
      exponent, minimum_bits, blinder_list);
}